

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

bool ast::Sections::address_is_free(Section *s)

{
  uint uVar1;
  const_iterator __position;
  long in_RDI;
  value_type local_8;
  
  __position._M_node = (_List_node_base *)&list_abi_cxx11_;
  while (__position._M_node = (__position._M_node)->_M_next,
        __position._M_node != (_List_node_base *)&list_abi_cxx11_) {
    uVar1 = *(uint *)((long)&__position._M_node[1]._M_next[2]._M_next + 4);
    if (*(int *)(in_RDI + 0x30) + *(uint *)(in_RDI + 0x24) <= uVar1) break;
    if (*(uint *)(in_RDI + 0x24) < uVar1 + *(int *)&__position._M_node[1]._M_next[3]._M_next) {
      return false;
    }
  }
  std::__cxx11::list<ast::Section_*,_std::allocator<ast::Section_*>_>::insert
            ((list<ast::Section_*,_std::allocator<ast::Section_*>_> *)&list_abi_cxx11_,__position,
             &local_8);
  return true;
}

Assistant:

bool Sections::address_is_free(Section *s)
{
	auto iter = list.begin();
	for (; iter != list.end(); ++iter) {
		Section *r = *iter;
		if (s->base_address + s->content_size > r->base_address
				&& r->base_address + r->content_size > s->base_address)
			return false;
		if (s->base_address + s->content_size <= r->base_address)
			break;
	}
	list.insert(iter, s);
	return true;
}